

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O3

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
     ::doEndThrowingInst(RedundantSetElimination *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  uintptr_t uVar3;
  TryTable *this;
  bool bVar4;
  ulong uVar5;
  pointer ppEVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  
  lVar8 = (long)(self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                .tryStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                .tryStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (lVar8 != ((long)(self->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                      ).
                      super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                      .throwingInstsStack.
                      super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(self->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                      ).
                      super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                      .throwingInstsStack.
                      super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    __assert_fail("self->tryStack.size() == self->throwingInstsStack.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x11a,
                  "static void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  uVar7 = (int)lVar8 - 1;
  if (-1 < (int)uVar7) {
    do {
      uVar9 = (ulong)uVar7;
      ppEVar6 = (self->
                super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                ).
                super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                .tryStack.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar2 = ppEVar6[uVar9];
      if ((pEVar2->_id == TryId) && (uVar3 = *(uintptr_t *)(pEVar2 + 7), uVar3 != 0)) {
        if (uVar3 == DAT_010b25a8) {
          return;
        }
        ppEVar6 = ppEVar6 + uVar9;
        uVar5 = 0;
        do {
          ppEVar6 = ppEVar6 + -1;
          if (uVar9 == uVar5) {
            __assert_fail("found",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                          ,0x12e,
                          "static void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doEndThrowingInst(SubType *, Expression **) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                         );
          }
          if ((*ppEVar6)->_id != TryId) {
            __assert_fail("int(_id) == int(T::SpecificId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                          ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
          }
          uVar5 = uVar5 + 1;
        } while ((*ppEVar6)[1].type.id != uVar3);
        uVar7 = uVar7 - (int)uVar5;
      }
      else {
        std::
        vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
        ::push_back((self->
                    super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                    ).
                    super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                    .throwingInstsStack.
                    super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar9,
                    &(self->
                     super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
                     ).
                     super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                     .currBasicBlock);
        this = (TryTable *)
               (self->
               super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>_>
               ).
               super_CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
               .tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9];
        IVar1 = (this->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression._id;
        if (IVar1 == TryTableId) {
          bVar4 = TryTable::hasCatchAll(this);
          if (bVar4) {
            return;
          }
        }
        else {
          if (IVar1 != TryId) {
            handle_unreachable("invalid throwingInstsStack item",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                               ,0x144);
          }
          if ((long)(this->catchDests).allocator - (long)(this->catchTags).allocator == 1) {
            return;
          }
        }
        uVar7 = uVar7 - 1;
      }
    } while (-1 < (int)uVar7);
  }
  return;
}

Assistant:

static void doEndThrowingInst(SubType* self, Expression** currp) {
    // If the innermost try/try_table does not have a catch_all clause, an
    // exception thrown can be caught by any of its outer catch block. And if
    // that outer try/try_table also does not have a catch_all, this continues
    // until we encounter a try/try_table-catch_all. Create a link to all those
    // possible catch unwind destinations.
    // TODO This can be more precise for `throw`s if we compare tag types and
    // create links to outer catch BBs only when the exception is not caught.
    // TODO This can also be more precise if we analyze the structure of nested
    // try-catches. For example, in the example below, 'call $foo' doesn't need
    // a link to the BB of outer 'catch $e1', because if the exception thrown by
    // the call is of tag $e1, it would've already been caught by the inner
    // 'catch $e1'. Optimize these cases later.
    // try
    //   try
    //     call $foo
    //   catch $e1
    //     ...
    //   catch $e2
    //     ...
    //   end
    // catch $e1
    //   ...
    // catch $e3
    //   ...
    // end
    assert(self->tryStack.size() == self->throwingInstsStack.size());
    for (int i = self->throwingInstsStack.size() - 1; i >= 0;) {
      if (auto* tryy = self->tryStack[i]->template dynCast<Try>()) {
        if (tryy->isDelegate()) {
          // If this delegates to the caller, there is no possibility that this
          // instruction can throw to outer catches.
          if (tryy->delegateTarget == DELEGATE_CALLER_TARGET) {
            break;
          }
          // If this delegates to an outer try, we skip catches between this try
          // and the target try.
          [[maybe_unused]] bool found = false;
          for (int j = i - 1; j >= 0; j--) {
            if (self->tryStack[j]->template cast<Try>()->name ==
                tryy->delegateTarget) {
              i = j;
              found = true;
              break;
            }
          }
          assert(found);
          continue;
        }
      }

      // Exception thrown. Note outselves so that we will create a link to each
      // catch within the try / each destination block within the try_table when
      // we get there.
      self->throwingInstsStack[i].push_back(self->currBasicBlock);

      if (auto* tryy = self->tryStack[i]->template dynCast<Try>()) {
        // If this try has catch_all, there is no possibility that this
        // instruction can throw to outer catches. Stop here.
        if (tryy->hasCatchAll()) {
          break;
        }
      } else if (auto* tryTable =
                   self->tryStack[i]->template dynCast<TryTable>()) {
        if (tryTable->hasCatchAll()) {
          break;
        }
      } else {
        WASM_UNREACHABLE("invalid throwingInstsStack item");
      }
      i--;
    }
  }